

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void d68020_rtm(m68k_info *info)

{
  byte bVar1;
  
  bVar1 = info->groups_count;
  info->groups_count = bVar1 + 1;
  info->groups[bVar1] = '\x03';
  if ((info->type & 4) == 0) {
    build_imm(info,0,info->ir);
    return;
  }
  MCInst_setOpcode(info->inst,0x142);
  (info->extension).op_count = '\x01';
  (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
  (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x0;
  (info->extension).operands[0].type = M68K_OP_IMM;
  (info->extension).operands[0].address_mode = M68K_AM_IMMEDIATE;
  (info->extension).operands[0].field_0.imm = 0;
  bVar1 = info->groups_count;
  info->groups_count = bVar1 + 1;
  info->groups[bVar1] = '\x01';
  (info->extension).operands[0].type = M68K_OP_REG;
  (info->extension).operands[0].address_mode = M68K_AM_NONE;
  (info->extension).operands[0].field_0.reg = (info->ir & 0xf) + M68K_REG_D0;
  return;
}

Assistant:

static void d68020_rtm(m68k_info *info)
{
	cs_m68k* ext;
	cs_m68k_op* op;

	set_insn_group(info, M68K_GRP_RET);

	LIMIT_CPU_TYPES(info, M68020_ONLY);

	build_absolute_jump_with_immediate(info, M68K_INS_RTM, 0, 0);

	ext = &info->extension;
	op = &ext->operands[0];

	op->address_mode = M68K_AM_NONE;
	op->type = M68K_OP_REG;

	if (BIT_3(info->ir)) {
		op->reg = M68K_REG_A0 + (info->ir & 7);
	} else {
		op->reg = M68K_REG_D0 + (info->ir & 7);
	}
}